

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_object_fromEntries(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue v_03;
  JSValue v_04;
  JSValue v_05;
  JSValue v_06;
  JSValue v_07;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue prop;
  JSValue val;
  JSValue v_08;
  JSValue method;
  JSValue enum_obj;
  JSValue enum_obj_00;
  JSValue v_09;
  JSValue JVar1;
  JSValue this_obj_01;
  JSValue obj_00;
  int iVar2;
  undefined4 in_ECX;
  JSValueUnion in_RDI;
  undefined8 *in_R8;
  JSValue JVar3;
  BOOL in_stack_00000070;
  JSValue item;
  JSValue value;
  JSValue key;
  BOOL done;
  JSValue iterable;
  JSValue next_method;
  JSValue iter;
  JSValue obj;
  JSContext *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  uint32_t in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  JSValueUnion in_stack_fffffffffffffe98;
  JSValueUnion in_stack_fffffffffffffea0;
  int64_t iVar4;
  JSValue in_stack_fffffffffffffeb0;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffed4;
  int64_t iVar6;
  int in_stack_fffffffffffffefc;
  JSValueUnion in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  BOOL in_stack_ffffffffffffff0c;
  JSValueUnion in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  BOOL in_stack_ffffffffffffff1c;
  JSValueUnion in_stack_ffffffffffffff20;
  JSValueUnion in_stack_ffffffffffffff28;
  JSValueUnion JVar7;
  JSValueUnion local_c8;
  JSValueUnion local_c0;
  int64_t local_b8;
  undefined1 local_ac [60];
  int64_t local_70;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int64_t in_stack_fffffffffffffff0;
  JSValueUnion local_8;
  
  local_ac._20_8_ = 0.0;
  local_ac._28_8_ = 1.48219693752374e-323;
  local_ac._4_8_ = *in_R8;
  local_ac._12_8_ = in_R8[1];
  JVar3 = JS_NewObject((JSContext *)0x1a9b98);
  local_c0 = JVar3.u;
  local_ac._52_8_ = local_c0;
  local_b8 = JVar3.tag;
  local_70 = local_b8;
  iVar2 = JS_IsException(JVar3);
  if (iVar2 == 0) {
    JVar3.u._4_4_ = in_stack_ffffffffffffff1c;
    JVar3.u.int32 = in_stack_ffffffffffffff18;
    JVar3.tag = (int64_t)in_stack_ffffffffffffff20.ptr;
    JVar3 = JS_GetIterator((JSContext *)in_stack_ffffffffffffff10.ptr,JVar3,
                           in_stack_ffffffffffffff0c);
    JVar7 = JVar3.u;
    local_c8 = (JSValueUnion)JVar3.tag;
    local_ac._44_8_ = local_c8;
    local_ac._36_8_ = JVar7;
    iVar2 = JS_IsException(JVar3);
    local_8 = in_stack_ffffffffffffff28;
    if (iVar2 == 0) {
      obj_00.tag = in_stack_fffffffffffffff0;
      obj_00.u.ptr = (void *)local_ac._44_8_;
      this_obj_01.tag = local_ac._36_8_;
      this_obj_01.u.ptr = in_RDI.ptr;
      JVar3 = JS_GetPropertyInternal
                        ((JSContext *)CONCAT44(0x6a,in_stack_ffffffffffffffd0),obj_00,
                         in_stack_ffffffffffffffcc,this_obj_01,in_stack_00000070);
      in_stack_ffffffffffffff20 = JVar3.u;
      local_8 = (JSValueUnion)JVar3.tag;
      local_ac._28_8_ = local_8;
      local_ac._20_8_ = in_stack_ffffffffffffff20;
      iVar2 = JS_IsException(JVar3);
      if (iVar2 == 0) {
        while( true ) {
          in_stack_fffffffffffffe80 = (JSContext *)local_ac;
          enum_obj.u._4_4_ = in_stack_ffffffffffffff1c;
          enum_obj.u.int32 = in_stack_ffffffffffffff18;
          enum_obj.tag = (int64_t)in_stack_ffffffffffffff20.ptr;
          method.u._4_4_ = in_stack_ffffffffffffff0c;
          method.u.int32 = in_stack_ffffffffffffff08;
          method.tag = (int64_t)in_stack_ffffffffffffff10.ptr;
          JVar3 = JS_IteratorNext((JSContext *)in_stack_ffffffffffffff00.ptr,enum_obj,method,
                                  in_stack_fffffffffffffefc,
                                  (JSValue *)CONCAT44(in_ECX,in_stack_ffffffffffffffa0),
                                  (BOOL *)in_RDI.ptr);
          in_stack_fffffffffffffefc = JVar3.tag._4_4_;
          iVar2 = JS_IsException(JVar3);
          if (iVar2 != 0) break;
          if (local_ac._0_4_ != 0) {
            v.u._4_4_ = in_stack_fffffffffffffe8c;
            v.u.int32 = in_stack_fffffffffffffe88;
            v.tag._0_4_ = in_stack_fffffffffffffe90;
            v.tag._4_4_ = in_stack_fffffffffffffe94;
            JS_FreeValue(in_stack_fffffffffffffe80,v);
            v_03.u._4_4_ = in_stack_fffffffffffffe8c;
            v_03.u.int32 = in_stack_fffffffffffffe88;
            v_03.tag._0_4_ = in_stack_fffffffffffffe90;
            v_03.tag._4_4_ = in_stack_fffffffffffffe94;
            JS_FreeValue(in_stack_fffffffffffffe80,v_03);
            v_04.u._4_4_ = in_stack_fffffffffffffe8c;
            v_04.u.int32 = in_stack_fffffffffffffe88;
            v_04.tag._0_4_ = in_stack_fffffffffffffe90;
            v_04.tag._4_4_ = in_stack_fffffffffffffe94;
            JS_FreeValue(in_stack_fffffffffffffe80,v_04);
            local_40 = (undefined4)local_ac._52_8_;
            uStack_3c = SUB84(local_ac._52_8_,4);
            local_38 = (undefined4)local_70;
            uVar5 = (undefined4)((ulong)local_70 >> 0x20);
            goto LAB_001aa0fb;
          }
          uVar5 = 0;
          iVar6 = 3;
          in_stack_ffffffffffffff1c = 0;
          v_08.tag._4_4_ = in_stack_fffffffffffffefc;
          v_08._0_12_ = JVar3._0_12_;
          iVar2 = JS_IsObject(v_08);
          if (iVar2 == 0) {
            JS_ThrowTypeErrorNotAnObject((JSContext *)0x1a9e7b);
LAB_001a9fb7:
            v_01.u._4_4_ = in_stack_fffffffffffffe8c;
            v_01.u.int32 = in_stack_fffffffffffffe88;
            v_01.tag._0_4_ = in_stack_fffffffffffffe90;
            v_01.tag._4_4_ = in_stack_fffffffffffffe94;
            JS_FreeValue(in_stack_fffffffffffffe80,v_01);
            break;
          }
          this_obj.tag = (int64_t)in_stack_fffffffffffffea0.ptr;
          this_obj.u.ptr = in_stack_fffffffffffffe98.ptr;
          JVar3 = JS_GetPropertyUint32
                            ((JSContext *)
                             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),this_obj,
                             in_stack_fffffffffffffe8c);
          in_stack_fffffffffffffea0 = JVar3.u;
          iVar4 = JVar3.tag;
          in_stack_ffffffffffffff18 = (undefined4)JVar3.tag;
          in_stack_ffffffffffffff1c = JVar3.tag._4_4_;
          in_stack_ffffffffffffff10 = in_stack_fffffffffffffea0;
          iVar2 = JS_IsException(JVar3);
          if (iVar2 != 0) goto LAB_001a9fb7;
          this_obj_00.tag = (int64_t)in_stack_fffffffffffffea0.ptr;
          this_obj_00.u.ptr = in_stack_fffffffffffffe98.ptr;
          JVar3 = JS_GetPropertyUint32
                            ((JSContext *)
                             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                             this_obj_00,in_stack_fffffffffffffe8c);
          in_stack_fffffffffffffe90 = JVar3.u._0_4_;
          in_stack_fffffffffffffe94 = JVar3.u._4_4_;
          in_stack_fffffffffffffe98 = (JSValueUnion)JVar3.tag;
          in_stack_ffffffffffffff00 = JVar3.u;
          in_stack_ffffffffffffff08 = (undefined4)JVar3.tag;
          in_stack_ffffffffffffff0c = JVar3.tag._4_4_;
          iVar2 = JS_IsException(JVar3);
          if (iVar2 != 0) {
            v_00.u._4_4_ = in_stack_fffffffffffffe8c;
            v_00.u.int32 = in_stack_fffffffffffffe88;
            v_00.tag._0_4_ = in_stack_fffffffffffffe90;
            v_00.tag._4_4_ = in_stack_fffffffffffffe94;
            JS_FreeValue(in_stack_fffffffffffffe80,v_00);
            goto LAB_001a9fb7;
          }
          in_stack_fffffffffffffe80 =
               (JSContext *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
          prop.tag = iVar4;
          prop.u.ptr = in_stack_fffffffffffffea0.ptr;
          val.u._4_4_ = in_stack_fffffffffffffed4;
          val.u.int32 = uVar5;
          val.tag = iVar6;
          iVar2 = JS_DefinePropertyValueValue
                            ((JSContext *)in_stack_fffffffffffffe98.ptr,in_stack_fffffffffffffeb0,
                             prop,val,in_stack_fffffffffffffe94);
          if (iVar2 < 0) goto LAB_001a9fb7;
          v_02.u._4_4_ = in_stack_fffffffffffffe8c;
          v_02.u.int32 = in_stack_fffffffffffffe88;
          v_02.tag._0_4_ = in_stack_fffffffffffffe90;
          v_02.tag._4_4_ = in_stack_fffffffffffffe94;
          JS_FreeValue(in_stack_fffffffffffffe80,v_02);
        }
      }
    }
    v_09.tag = local_ac._44_8_;
    v_09.u = (JSValueUnion)local_ac._36_8_;
    iVar2 = JS_IsObject(v_09);
    if (iVar2 != 0) {
      enum_obj_00.tag = (int64_t)JVar7.ptr;
      enum_obj_00.u.float64 = local_8.float64;
      JS_IteratorClose((JSContext *)in_stack_ffffffffffffff20.ptr,enum_obj_00,
                       in_stack_ffffffffffffff1c);
    }
    v_05.u._4_4_ = in_stack_fffffffffffffe8c;
    v_05.u.int32 = in_stack_fffffffffffffe88;
    v_05.tag._0_4_ = in_stack_fffffffffffffe90;
    v_05.tag._4_4_ = in_stack_fffffffffffffe94;
    JS_FreeValue(in_stack_fffffffffffffe80,v_05);
    v_06.u._4_4_ = in_stack_fffffffffffffe8c;
    v_06.u.int32 = in_stack_fffffffffffffe88;
    v_06.tag._0_4_ = in_stack_fffffffffffffe90;
    v_06.tag._4_4_ = in_stack_fffffffffffffe94;
    JS_FreeValue(in_stack_fffffffffffffe80,v_06);
    v_07.u._4_4_ = in_stack_fffffffffffffe8c;
    v_07.u.int32 = in_stack_fffffffffffffe88;
    v_07.tag._0_4_ = in_stack_fffffffffffffe90;
    v_07.tag._4_4_ = in_stack_fffffffffffffe94;
    JS_FreeValue(in_stack_fffffffffffffe80,v_07);
    local_40 = 0;
    local_38 = 6;
    uVar5 = 0;
  }
  else {
    local_40 = (undefined4)local_ac._52_8_;
    uStack_3c = SUB84(local_ac._52_8_,4);
    local_38 = (undefined4)local_70;
    uVar5 = (undefined4)((ulong)local_70 >> 0x20);
  }
LAB_001aa0fb:
  JVar1.u._4_4_ = uStack_3c;
  JVar1.u.int32 = local_40;
  JVar1.tag._0_4_ = local_38;
  JVar1.tag._4_4_ = uVar5;
  return JVar1;
}

Assistant:

static JSValue js_object_fromEntries(JSContext *ctx, JSValueConst this_val,
                                     int argc, JSValueConst *argv)
{
    JSValue obj, iter, next_method = JS_UNDEFINED;
    JSValueConst iterable;
    BOOL done;

    /*  RequireObjectCoercible() not necessary because it is tested in
        JS_GetIterator() by JS_GetProperty() */
    iterable = argv[0];

    obj = JS_NewObject(ctx);
    if (JS_IsException(obj))
        return obj;
    
    iter = JS_GetIterator(ctx, iterable, FALSE);
    if (JS_IsException(iter))
        goto fail;
    next_method = JS_GetProperty(ctx, iter, JS_ATOM_next);
    if (JS_IsException(next_method))
        goto fail;
    
    for(;;) {
        JSValue key, value, item;
        item = JS_IteratorNext(ctx, iter, next_method, 0, NULL, &done);
        if (JS_IsException(item))
            goto fail;
        if (done) {
            JS_FreeValue(ctx, item);
            break;
        }
        
        key = JS_UNDEFINED;
        value = JS_UNDEFINED;
        if (!JS_IsObject(item)) {
            JS_ThrowTypeErrorNotAnObject(ctx);
            goto fail1;
        }
        key = JS_GetPropertyUint32(ctx, item, 0);
        if (JS_IsException(key))
            goto fail1;
        value = JS_GetPropertyUint32(ctx, item, 1);
        if (JS_IsException(value)) {
            JS_FreeValue(ctx, key);
            goto fail1;
        }
        if (JS_DefinePropertyValueValue(ctx, obj, key, value,
                                        JS_PROP_C_W_E | JS_PROP_THROW) < 0) {
        fail1:
            JS_FreeValue(ctx, item);
            goto fail;
        }
        JS_FreeValue(ctx, item);
    }
    JS_FreeValue(ctx, next_method);
    JS_FreeValue(ctx, iter);
    return obj;
 fail:
    if (JS_IsObject(iter)) {
        /* close the iterator object, preserving pending exception */
        JS_IteratorClose(ctx, iter, TRUE);
    }
    JS_FreeValue(ctx, next_method);
    JS_FreeValue(ctx, iter);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}